

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O0

void __thiscall
TPZGenGrid2D::TPZGenGrid2D
          (TPZGenGrid2D *this,TPZVec<int> *nx,TPZVec<double> *x0,TPZVec<double> *x1,int numl,
          REAL rot)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  int *piVar7;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  TPZVec<int> *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined8 in_XMM0_Qa;
  double dVar8;
  int64_t in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int64_t in_stack_ffffffffffffff08;
  TPZManVector<double,_10> *in_stack_ffffffffffffff10;
  TPZVec<double> *in_stack_ffffffffffffff18;
  TPZManVector<double,_10> *in_stack_ffffffffffffff20;
  
  *in_RDI = &PTR__TPZGenGrid2D_025a3480;
  TPZManVector<int,_10>::TPZManVector
            ((TPZManVector<int,_10> *)in_stack_ffffffffffffff20,
             (TPZVec<int> *)in_stack_ffffffffffffff18);
  TPZManVector<double,_10>::TPZManVector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZManVector<double,_10>::TPZManVector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZManVector<double,_10>::TPZManVector
            ((TPZManVector<double,_10> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  TPZManVector<double,_10>::TPZManVector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (double *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  *(undefined4 *)((long)in_RDI + 0x21c) = in_R8D;
  in_RDI[0x44] = in_XMM0_Qa;
  *(undefined1 *)(in_RDI + 0x45) = 0;
  *(undefined1 *)((long)in_RDI + 0x229) = 0;
  in_RDI[0x46] = 0;
  *(undefined1 *)(in_RDI + 0x47) = 0;
  pdVar6 = TPZVec<double>::operator[](in_RCX,0);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDX,0);
  dVar1 = *pdVar6;
  piVar7 = TPZVec<int>::operator[](in_RSI,0);
  iVar2 = *piVar7;
  pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x26),0);
  *pdVar6 = (dVar8 - dVar1) / (double)iVar2;
  pdVar6 = TPZVec<double>::operator[](in_RCX,1);
  dVar8 = *pdVar6;
  pdVar6 = TPZVec<double>::operator[](in_RDX,1);
  dVar1 = *pdVar6;
  piVar7 = TPZVec<int>::operator[](in_RSI,1);
  dVar8 = (dVar8 - dVar1) / (double)*piVar7;
  pdVar6 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x26),1);
  *pdVar6 = dVar8;
  piVar7 = TPZVec<int>::operator[](in_RSI,0);
  iVar5 = *piVar7 + 1;
  piVar7 = TPZVec<int>::operator[](in_RSI,1);
  iVar2 = *piVar7;
  iVar3 = *(int *)((long)in_RDI + 0x21c);
  piVar7 = TPZVec<int>::operator[](in_RSI,0);
  iVar4 = *piVar7;
  piVar7 = TPZVec<int>::operator[](in_RSI,1);
  in_RDI[0x42] = (long)(iVar5 * (iVar2 + 1) + (iVar3 + -1) * iVar4 * (*piVar7 + 1));
  *(undefined4 *)(in_RDI + 0x43) = 0;
  return;
}

Assistant:

TPZGenGrid2D::TPZGenGrid2D(const TPZVec<int> &nx, const TPZVec<REAL> &x0, const TPZVec<REAL> &x1, int numl, REAL rot) : fNx(nx), fX0(x0), fX1(x1),
fDelx(2), fGeometricProgression(2, 1.), fNumLayers(numl), fRotAngle(rot), fZigZag(false), fTrapeze(false), fDistortion(0.), fRefPattern(false) {
    fDelx[0] = (x1[0] - x0[0]) / (nx[0]); // Delta x
    fDelx[1] = (x1[1] - x0[1]) / (nx[1]); // Delta y
    fNumNodes = (nx[0] + 1)*(nx[1] + 1)+(fNumLayers - 1)*(nx[0])*(nx[1] + 1);
    fMeshType = MMeshType::EQuadrilateral;
}